

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O3

nng_err nng_http_handler_alloc_redirect
                  (nng_http_handler **hp,char *uri,nng_http_status status,char *where)

{
  nng_err nVar1;
  
  nVar1 = nni_http_handler_init_redirect(hp,uri,status,where);
  return nVar1;
}

Assistant:

nng_err
nng_http_handler_alloc_redirect(nng_http_handler **hp, const char *uri,
    nng_http_status status, const char *where)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_handler_init_redirect(hp, uri, status, where));
#else
	NNI_ARG_UNUSED(hp);
	NNI_ARG_UNUSED(uri);
	NNI_ARG_UNUSED(status);
	NNI_ARG_UNUSED(where);
	return (NNG_ENOTSUP);
#endif
}